

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::PathArcTo
          (ImDrawList *this,ImVec2 *centre,float radius,float amin,float amax,int num_segments)

{
  int *piVar1;
  float fVar2;
  float fVar3;
  ImVec2 IVar4;
  int iVar5;
  ImVec2 *pIVar6;
  ImVec2 *pIVar7;
  ImGuiContext *pIVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  
  pIVar8 = GImGui;
  if ((radius == 0.0) && (!NAN(radius))) {
    iVar10 = (this->_Path).Size;
    if (iVar10 == (this->_Path).Capacity) {
      if (iVar10 == 0) {
        iVar9 = 8;
      }
      else {
        iVar9 = iVar10 / 2 + iVar10;
      }
      iVar5 = iVar10 + 1;
      if (iVar10 + 1 < iVar9) {
        iVar5 = iVar9;
      }
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + 1;
      pIVar6 = (ImVec2 *)(*(pIVar8->IO).MemAllocFn)((long)iVar5 << 3);
      pIVar7 = (this->_Path).Data;
      if (pIVar7 == (ImVec2 *)0x0) {
LAB_0014d4ff:
        pIVar7 = (ImVec2 *)0x0;
        pIVar8 = GImGui;
      }
      else {
        memcpy(pIVar6,pIVar7,(long)(this->_Path).Size << 3);
        pIVar8 = GImGui;
        pIVar7 = (this->_Path).Data;
        if (pIVar7 == (ImVec2 *)0x0) goto LAB_0014d4ff;
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
      }
      (*(pIVar8->IO).MemFreeFn)(pIVar7);
      (this->_Path).Data = pIVar6;
      (this->_Path).Capacity = iVar5;
      iVar10 = (this->_Path).Size;
    }
    else {
      pIVar6 = (this->_Path).Data;
    }
    (this->_Path).Size = iVar10 + 1;
    pIVar6[iVar10] = *centre;
  }
  pIVar8 = GImGui;
  lVar12 = (long)(num_segments + 1) + (long)(this->_Path).Size;
  iVar10 = (int)lVar12;
  if (iVar10 <= (this->_Path).Capacity) goto LAB_0014d59c;
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  pIVar7 = (ImVec2 *)(*(pIVar8->IO).MemAllocFn)(lVar12 * 8);
  pIVar6 = (this->_Path).Data;
  if (pIVar6 == (ImVec2 *)0x0) {
LAB_0014d58c:
    pIVar6 = (ImVec2 *)0x0;
    pIVar8 = GImGui;
  }
  else {
    memcpy(pIVar7,pIVar6,(long)(this->_Path).Size << 3);
    pIVar8 = GImGui;
    pIVar6 = (this->_Path).Data;
    if (pIVar6 == (ImVec2 *)0x0) goto LAB_0014d58c;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar8->IO).MemFreeFn)(pIVar6);
  (this->_Path).Data = pIVar7;
  (this->_Path).Capacity = iVar10;
LAB_0014d59c:
  if (-1 < num_segments) {
    iVar10 = 0;
    do {
      fVar14 = ((float)iVar10 / (float)num_segments) * (amax - amin) + amin;
      fVar2 = centre->x;
      fVar13 = cosf(fVar14);
      fVar3 = centre->y;
      fVar14 = sinf(fVar14);
      pIVar8 = GImGui;
      iVar9 = (this->_Path).Size;
      if (iVar9 == (this->_Path).Capacity) {
        if (iVar9 == 0) {
          iVar5 = 8;
        }
        else {
          iVar5 = iVar9 / 2 + iVar9;
        }
        iVar11 = iVar9 + 1;
        if (iVar9 + 1 < iVar5) {
          iVar11 = iVar5;
        }
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        pIVar6 = (ImVec2 *)(*(pIVar8->IO).MemAllocFn)((long)iVar11 << 3);
        pIVar7 = (this->_Path).Data;
        if (pIVar7 == (ImVec2 *)0x0) {
LAB_0014d6af:
          pIVar7 = (ImVec2 *)0x0;
          pIVar8 = GImGui;
        }
        else {
          memcpy(pIVar6,pIVar7,(long)(this->_Path).Size << 3);
          pIVar8 = GImGui;
          pIVar7 = (this->_Path).Data;
          if (pIVar7 == (ImVec2 *)0x0) goto LAB_0014d6af;
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(pIVar8->IO).MemFreeFn)(pIVar7);
        (this->_Path).Data = pIVar6;
        (this->_Path).Capacity = iVar11;
        iVar9 = (this->_Path).Size;
      }
      else {
        pIVar6 = (this->_Path).Data;
      }
      (this->_Path).Size = iVar9 + 1;
      IVar4.y = fVar3 + fVar14 * radius;
      IVar4.x = fVar2 + fVar13 * radius;
      pIVar6[iVar9] = IVar4;
      iVar10 = iVar10 + 1;
    } while (num_segments + 1 != iVar10);
  }
  return;
}

Assistant:

void ImDrawList::PathArcTo(const ImVec2& centre, float radius, float amin, float amax, int num_segments)
{
    if (radius == 0.0f)
        _Path.push_back(centre);
    _Path.reserve(_Path.Size + (num_segments + 1));
    for (int i = 0; i <= num_segments; i++)
    {
        const float a = amin + ((float)i / (float)num_segments) * (amax - amin);
        _Path.push_back(ImVec2(centre.x + cosf(a) * radius, centre.y + sinf(a) * radius));
    }
}